

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall xatlas::internal::segment::ClusteredCharts::mergeCharts(ClusteredCharts *this)

{
  Array<xatlas::internal::segment::ClusteredCharts::Chart_*> *this_00;
  Array<int> *this_01;
  Array<float> *this_02;
  Array<float> *this_03;
  Array<unsigned_int> *this_04;
  uint uVar1;
  Chart *owner;
  Chart *chart;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Chart **ppCVar5;
  uint *puVar6;
  float *pfVar7;
  uint32_t *puVar8;
  int *piVar9;
  bool bVar10;
  uint32_t i;
  uint32_t index;
  uint32_t uVar11;
  uint32_t uVar12;
  float fVar13;
  float fVar14;
  FaceEdgeIterator it;
  float local_9c;
  FaceEdgeIterator local_58;
  ulong local_40;
  Array<unsigned_int> *local_38;
  
  this_00 = &this->m_charts;
  uVar1 = (this->m_charts).m_base.size;
  local_40 = (ulong)uVar1;
  uVar3 = uVar1 - 1;
  this_02 = &this->m_sharedBoundaryLengths;
  this_03 = &this->m_sharedBoundaryLengthsNoSeams;
  this_04 = &this->m_sharedBoundaryEdgeCountNoSeams;
  this_01 = &this->m_faceCharts;
  bVar10 = false;
  uVar12 = uVar3;
  do {
    while ((int)uVar12 < 0) {
LAB_001216b5:
      uVar11 = 0;
      bVar2 = !bVar10;
      bVar10 = false;
      uVar12 = uVar3;
      if (bVar2) {
        do {
          while( true ) {
            if ((int)(this->m_charts).m_base.size <= (int)uVar11) {
              return;
            }
            ppCVar5 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                                (this_00,uVar11);
            if (*ppCVar5 == (Chart *)0x0) break;
            ppCVar5 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                                (this_00,uVar11);
            (*ppCVar5)->id = uVar11;
            uVar11 = uVar11 + 1;
          }
          ArrayBase::removeAt(&this_00->m_base,uVar11);
          uVar12 = (this->m_faceCharts).m_base.size;
          for (uVar3 = 0; uVar12 != uVar3; uVar3 = uVar3 + 1) {
            puVar8 = (uint32_t *)Array<int>::operator[](this_01,uVar3);
            if (*puVar8 == uVar11) {
              __assert_fail("m_faceCharts[i] != c",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                            ,0x15ec,"void xatlas::internal::segment::ClusteredCharts::mergeCharts()"
                           );
            }
            piVar9 = Array<int>::operator[](this_01,uVar3);
            if ((int)(this->m_charts).m_base.size < *piVar9) {
              __assert_fail("m_faceCharts[i] <= int32_t(m_charts.size())",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                            ,0x15ed,"void xatlas::internal::segment::ClusteredCharts::mergeCharts()"
                           );
            }
            piVar9 = Array<int>::operator[](this_01,uVar3);
            if ((int)uVar11 < *piVar9) {
              piVar9 = Array<int>::operator[](this_01,uVar3);
              *piVar9 = *piVar9 + -1;
            }
          }
        } while( true );
      }
    }
    ppCVar5 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[](this_00,uVar12)
    ;
    owner = *ppCVar5;
    if (owner != (Chart *)0x0) {
      uVar11 = (uint32_t)local_40;
      Array<float>::resize(this_02,uVar11);
      Array<float>::zeroOutMemory(this_02);
      Array<float>::resize(this_03,uVar11);
      Array<float>::zeroOutMemory(this_03);
      Array<unsigned_int>::resize(this_04,uVar11);
      Array<unsigned_int>::zeroOutMemory(this_04);
      local_38 = &owner->faces;
      uVar11 = (owner->faces).m_base.size;
      local_9c = 0.0;
      for (index = 0; index != uVar11; index = index + 1) {
        puVar6 = Array<unsigned_int>::operator[](local_38,index);
        local_58.m_face = *puVar6;
        local_58.m_mesh = this->m_data->mesh;
        local_58.m_relativeEdge = 0;
        local_58.m_edge = local_58.m_face * 3;
        while (local_58.m_relativeEdge != 3) {
          pfVar7 = Array<float>::operator[](&this->m_data->edgeLengths,local_58.m_edge);
          fVar13 = *pfVar7;
          bVar2 = Mesh::FaceEdgeIterator::isBoundary(&local_58);
          if (bVar2) {
LAB_00121434:
            local_9c = local_9c + fVar13;
          }
          else {
            uVar4 = Mesh::FaceEdgeIterator::oppositeFace(&local_58);
            puVar8 = (uint32_t *)Array<int>::operator[](this_01,uVar4);
            uVar4 = *puVar8;
            if (uVar4 == 0xffffffff) goto LAB_00121434;
            ppCVar5 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                                (this_00,uVar4);
            if (*ppCVar5 != owner) {
              bVar2 = Mesh::FaceEdgeIterator::isSeam(&local_58);
              if ((bVar2) &&
                 ((bVar2 = isNormalSeam(this,local_58.m_edge), bVar2 ||
                  (bVar2 = Mesh::FaceEdgeIterator::isTextureSeam(&local_58), bVar2)))) {
                local_9c = local_9c + fVar13;
              }
              else {
                pfVar7 = Array<float>::operator[](this_02,uVar4);
                *pfVar7 = *pfVar7 + fVar13;
              }
              pfVar7 = Array<float>::operator[](this_03,uVar4);
              *pfVar7 = fVar13 + *pfVar7;
              puVar6 = Array<unsigned_int>::operator[](this_04,uVar4);
              *puVar6 = *puVar6 + 1;
            }
          }
          if (local_58.m_relativeEdge < 3) {
            local_58.m_edge = local_58.m_edge + 1;
            local_58.m_relativeEdge = local_58.m_relativeEdge + 1;
          }
        }
      }
      for (uVar11 = uVar3; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
        if (uVar12 != uVar11) {
          ppCVar5 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                              (this_00,uVar11);
          chart = *ppCVar5;
          if (((chart != (Chart *)0x0) &&
              (pfVar7 = Array<float>::operator[](this_02,uVar11), 0.0 < *pfVar7)) &&
             (fVar13 = dot(&(chart->basis).normal,&(owner->basis).normal), 0.5 <= fVar13)) {
            fVar13 = (this->m_data->options).maxChartArea;
            if (((fVar13 <= 0.0) || (owner->area + chart->area <= fVar13)) &&
               (((this->m_data->options).maxBoundaryLength <= 0.0 ||
                (fVar13 = owner->boundaryLength, fVar14 = chart->boundaryLength,
                pfVar7 = Array<float>::operator[](this_03,uVar11),
                fVar13 = (fVar13 + fVar14) - *pfVar7,
                pfVar7 = &(this->m_data->options).maxBoundaryLength,
                fVar13 < *pfVar7 || fVar13 == *pfVar7)))) {
              pfVar7 = Array<float>::operator[](this_03,uVar11);
              if ((((*pfVar7 <= 0.0) || ((owner->faces).m_base.size < 2)) ||
                  (((chart->faces).m_base.size != 1 || (owner->area * 0.1 < chart->area)))) &&
                 (((chart->faces).m_base.size != 2 ||
                  (puVar6 = Array<unsigned_int>::operator[](this_04,uVar11), *puVar6 < 2)))) {
                pfVar7 = Array<float>::operator[](this_03,uVar11);
                if (0.0 < *pfVar7) {
                  pfVar7 = Array<float>::operator[](this_03,uVar11);
                  bVar2 = equal(*pfVar7,chart->boundaryLength,0.0001);
                  if (bVar2) goto LAB_0012167f;
                }
                pfVar7 = Array<float>::operator[](this_02,uVar11);
                fVar14 = owner->boundaryLength - local_9c;
                fVar13 = 0.0;
                if (0.0 <= fVar14) {
                  fVar13 = fVar14;
                }
                if ((*pfVar7 <= fVar13 * 0.2) &&
                   (pfVar7 = Array<float>::operator[](this_02,uVar11),
                   *pfVar7 <= chart->boundaryLength * 0.75)) goto LAB_001216a1;
              }
LAB_0012167f:
              pfVar7 = Array<float>::operator[](this_03,uVar11);
              bVar2 = mergeChart(this,owner,chart,*pfVar7);
              if (bVar2) {
                bVar10 = true;
                break;
              }
            }
          }
        }
LAB_001216a1:
      }
      if (bVar10) goto LAB_001216b5;
    }
    uVar12 = uVar12 - 1;
  } while( true );
}

Assistant:

void mergeCharts()
	{
		XA_PROFILE_START(clusteredChartsMerge)
		const uint32_t chartCount = m_charts.size();
		// Merge charts progressively until there's none left to merge.
		for (;;) {
			bool merged = false;
			for (int c = chartCount - 1; c >= 0; c--) {
				Chart *chart = m_charts[c];
				if (chart == nullptr)
					continue;
				float externalBoundaryLength = 0.0f;
				m_sharedBoundaryLengths.resize(chartCount);
				m_sharedBoundaryLengths.zeroOutMemory();
				m_sharedBoundaryLengthsNoSeams.resize(chartCount);
				m_sharedBoundaryLengthsNoSeams.zeroOutMemory();
				m_sharedBoundaryEdgeCountNoSeams.resize(chartCount);
				m_sharedBoundaryEdgeCountNoSeams.zeroOutMemory();
				const uint32_t faceCount = chart->faces.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					const uint32_t f = chart->faces[i];
					for (Mesh::FaceEdgeIterator it(m_data.mesh, f); !it.isDone(); it.advance()) {
						const float l = m_data.edgeLengths[it.edge()];
						if (it.isBoundary()) {
							externalBoundaryLength += l;
						} else {
							const int neighborChart = m_faceCharts[it.oppositeFace()];
							if (neighborChart == -1)
								externalBoundaryLength += l;
							else if (m_charts[neighborChart] != chart) {
								if ((it.isSeam() && (isNormalSeam(it.edge()) || it.isTextureSeam()))) {
									externalBoundaryLength += l;
								} else {
									m_sharedBoundaryLengths[neighborChart] += l;
								}
								m_sharedBoundaryLengthsNoSeams[neighborChart] += l;
								m_sharedBoundaryEdgeCountNoSeams[neighborChart]++;
							}
						}
					}
				}
				for (int cc = chartCount - 1; cc >= 0; cc--) {
					if (cc == c)
						continue;
					Chart *chart2 = m_charts[cc];
					if (chart2 == nullptr)
						continue;
					// Must share a boundary.
					if (m_sharedBoundaryLengths[cc] <= 0.0f)
						continue;
					// Compare proxies.
					if (dot(chart2->basis.normal, chart->basis.normal) < XA_MERGE_CHARTS_MIN_NORMAL_DEVIATION)
						continue;
					// Obey max chart area and boundary length.
					if (m_data.options.maxChartArea > 0.0f && chart->area + chart2->area > m_data.options.maxChartArea)
						continue;
					if (m_data.options.maxBoundaryLength > 0.0f && chart->boundaryLength + chart2->boundaryLength - m_sharedBoundaryLengthsNoSeams[cc] > m_data.options.maxBoundaryLength)
						continue;
					// Merge if chart2 has a single face.
					// chart1 must have more than 1 face.
					// chart2 area must be <= 10% of chart1 area.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && chart->faces.size() > 1 && chart2->faces.size() == 1 && chart2->area <= chart->area * 0.1f)
						goto merge;
					// Merge if chart2 has two faces (probably a quad), and chart1 bounds at least 2 of its edges.
					if (chart2->faces.size() == 2 && m_sharedBoundaryEdgeCountNoSeams[cc] >= 2)
						goto merge;
					// Merge if chart2 is wholely inside chart1, ignoring seams.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && equal(m_sharedBoundaryLengthsNoSeams[cc], chart2->boundaryLength, kEpsilon))
						goto merge;
					if (m_sharedBoundaryLengths[cc] > 0.2f * max(0.0f, chart->boundaryLength - externalBoundaryLength) ||
						m_sharedBoundaryLengths[cc] > 0.75f * chart2->boundaryLength)
						goto merge;
					continue;
				merge:
					if (!mergeChart(chart, chart2, m_sharedBoundaryLengthsNoSeams[cc]))
						continue;
					merged = true;
					break;
				}
				if (merged)
					break;
			}
			if (!merged)
				break;
		}
		// Remove deleted charts.
		for (int c = 0; c < int32_t(m_charts.size()); /*do not increment if removed*/) {
			if (m_charts[c] == nullptr) {
				m_charts.removeAt(c);
				// Update m_faceCharts.
				const uint32_t faceCount = m_faceCharts.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					XA_DEBUG_ASSERT(m_faceCharts[i] != c);
					XA_DEBUG_ASSERT(m_faceCharts[i] <= int32_t(m_charts.size()));
					if (m_faceCharts[i] > c) {
						m_faceCharts[i]--;
					}
				}
			} else {
				m_charts[c]->id = c;
				c++;
			}
		}
		XA_PROFILE_END(clusteredChartsMerge)
	}